

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sector.cpp
# Opt level: O3

Merge __thiscall Sector::merge(Sector *this,Sector *sector)

{
  pointer pDVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  Merge MVar6;
  Merge MVar7;
  Data *data;
  pointer new_data;
  
  MVar7 = Unchanged;
  if (sector->m_bad_id_crc == false) {
    bVar5 = Header::operator==(&sector->header,&this->header);
    if (!bVar5) {
      __assert_fail("sector.header == header",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/Sector.cpp"
                    ,0xda,"Sector::Merge Sector::merge(Sector &&)");
    }
    if (sector->datarate != this->datarate) {
      __assert_fail("sector.datarate == datarate",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/Sector.cpp"
                    ,0xdb,"Sector::Merge Sector::merge(Sector &&)");
    }
    if (sector->encoding != this->encoding) {
      __assert_fail("sector.encoding == encoding",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/Sector.cpp"
                    ,0xdc,"Sector::Merge Sector::merge(Sector &&)");
    }
    bVar5 = this->m_bad_id_crc == true;
    if (bVar5) {
      iVar2 = (sector->header).head;
      iVar3 = (sector->header).sector;
      iVar4 = (sector->header).size;
      (this->header).cyl = (sector->header).cyl;
      (this->header).head = iVar2;
      (this->header).sector = iVar3;
      (this->header).size = iVar4;
      this->m_bad_id_crc = false;
    }
    MVar7 = (Merge)bVar5;
    if ((this->m_bad_data_crc != false) || (sector->m_bad_data_crc == false)) {
      new_data = (sector->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pDVar1 = (sector->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (new_data != pDVar1) {
        do {
          MVar6 = add(this,new_data,sector->m_bad_data_crc,sector->dam);
          if (MVar7 == Unchanged) {
            MVar7 = MVar6;
          }
          if (MVar6 == Improved) {
            MVar7 = MVar6;
          }
          new_data = new_data + 1;
        } while (new_data != pDVar1);
        new_data = (sector->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                   super__Vector_impl_data._M_start;
      }
      std::vector<Data,_std::allocator<Data>_>::_M_erase_at_end(&sector->m_data,new_data);
    }
  }
  return MVar7;
}

Assistant:

Sector::Merge Sector::merge(Sector&& sector)
{
    Merge ret = Merge::Unchanged;

    // If the new header CRC is bad there's nothing we can use
    if (sector.has_badidcrc())
        return Merge::Unchanged;

    // Something is wrong if the new details don't match the existing one
    assert(sector.header == header);
    assert(sector.datarate == datarate);
    assert(sector.encoding == encoding);

    // If the existing header is bad, repair it
    if (has_badidcrc())
    {
        header = sector.header;
        set_badidcrc(false);
        ret = Merge::Improved;
    }

    // We can't repair good data with bad
    if (!has_baddatacrc() && sector.has_baddatacrc())
        return ret;

    // Add the new data snapshots
    for (Data& data : sector.m_data)
    {
        // Move the data into place, passing on the existing data CRC status and DAM
        auto add_ret = add(std::move(data), sector.has_baddatacrc(), sector.dam);
        if (add_ret == Merge::Improved || (ret == Merge::Unchanged))
            ret = add_ret;
    }
    sector.m_data.clear();

    return ret;
}